

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_event_list.c
# Opt level: O2

int EventListClear(EventListHandle handle)

{
  uni_mutex_t *mutex;
  int *is_running;
  
  mutex = (uni_mutex_t *)((long)handle + 0x60);
  is_running = (int *)((long)handle + 0x78);
  _consume_one_list((list_head *)handle,(EventHandler)0x0,(_interruptable_handler)0x0,(void *)0x0,
                    mutex,(int *)((long)handle + 0x30),is_running);
  _consume_one_list((list_head *)((long)handle + 0x10),(EventHandler)0x0,(_interruptable_handler)0x0
                    ,(void *)0x0,mutex,(int *)((long)handle + 0x34),is_running);
  _consume_one_list((list_head *)((long)handle + 0x20),(EventHandler)0x0,(_interruptable_handler)0x0
                    ,(void *)0x0,mutex,(int *)((long)handle + 0x38),is_running);
  return 0;
}

Assistant:

int EventListClear(EventListHandle handle) {
  EventList *event_list = (EventList *)handle;
  _consume_highest_list(&event_list->highest_list, NULL, NULL, NULL,
                        &event_list->mutex, &event_list->highest_cnt,
                        &event_list->is_running);
  _consume_medium_list(&event_list->medium_list, NULL, NULL, NULL,
                       &event_list->mutex, &event_list->medium_cnt,
                       &event_list->is_running);
  _consume_lowest_list(&event_list->lowest_list, NULL, NULL, NULL,
                       &event_list->mutex, &event_list->lowest_cnt,
                       &event_list->is_running);
  return 0;
}